

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdGraph.cpp
# Opt level: O3

void __thiscall HACD::Graph::Print(Graph *this)

{
  ostream *poVar1;
  pointer pGVar2;
  pointer pGVar3;
  pointer pGVar4;
  ulong uVar5;
  pointer pGVar6;
  ulong uVar7;
  long lVar8;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"-----------------------------",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vertices (",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  pGVar6 = (this->m_vertices).
           super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar2 = (this->m_vertices).
           super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pGVar2 != pGVar6) {
    uVar5 = 0;
    do {
      if (pGVar6[uVar5].m_deleted == false) {
        poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t",1);
        if (pGVar6[uVar5].m_edges.m_size != 0) {
          uVar7 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"(",1);
            poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
            poVar1 = std::ostream::_M_insert<long>((long)poVar1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar1,") ",2);
            uVar7 = uVar7 + 1;
          } while (uVar7 < pGVar6[uVar5].m_edges.m_size);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
        std::ostream::put(-0x20);
        std::ostream::flush();
        pGVar6 = (this->m_vertices).
                 super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pGVar2 = (this->m_vertices).
                 super__Vector_base<HACD::GraphVertex,_std::allocator<HACD::GraphVertex>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)(((long)pGVar2 - (long)pGVar6 >> 4) * 0x7d6343eb1a1f58d1));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"vertices (",10);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  pGVar3 = (this->m_edges).super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pGVar4 = (this->m_edges).super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pGVar4 != pGVar3) {
    lVar8 = 0;
    uVar5 = 0;
    do {
      if ((&pGVar3->m_deleted)[lVar8] == false) {
        poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\t(",2);
        poVar1 = std::ostream::_M_insert<long>((long)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
        poVar1 = std::ostream::_M_insert<long>((long)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar1,") ",2);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
        std::ostream::put((char)poVar1);
        std::ostream::flush();
        pGVar3 = (this->m_edges).
                 super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pGVar4 = (this->m_edges).
                 super__Vector_base<HACD::GraphEdge,_std::allocator<HACD::GraphEdge>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar5 = uVar5 + 1;
      lVar8 = lVar8 + 0x30;
    } while (uVar5 < (ulong)(((long)pGVar4 - (long)pGVar3 >> 4) * -0x5555555555555555));
  }
  return;
}

Assistant:

void Graph::Print() const
	{
		std::cout << "-----------------------------" << std::endl;
        std::cout << "vertices (" << m_nV << ")" << std::endl;
        for (size_t v = 0; v < m_vertices.size(); ++v) 
		{
			const GraphVertex & currentVertex = m_vertices[v];
			if (!m_vertices[v].m_deleted)
			{

				std::cout  << currentVertex.m_name	  << "\t";
				long idEdge;
				for(size_t ed = 0; ed < currentVertex.m_edges.Size(); ++ed) 
				{
                    idEdge = currentVertex.m_edges[ed];
					std::cout  << "(" << m_edges[idEdge].m_v1 << "," << m_edges[idEdge].m_v2 << ") "; 	  
				}
				std::cout << std::endl;
			}			
		}

		std::cout << "vertices (" << m_nE << ")" << std::endl;
		for (size_t e = 0; e < m_edges.size(); ++e) 
		{
			const GraphEdge & currentEdge = m_edges[e];
			if (!m_edges[e].m_deleted)
			{
				std::cout  << currentEdge.m_name	  << "\t(" 
						   << m_edges[e].m_v1		  << "," 
						   << m_edges[e].m_v2		  << ") "<< std::endl;
			}			
		}
	}